

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_connect_common(connectdata *conn,int sockindex,_Bool nonblocking,_Bool *done)

{
  byte bVar1;
  SSL *ssl;
  proxy_info *ppVar2;
  _Bool _Var3;
  int iVar4;
  curl_proxytype cVar5;
  CURLcode CVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  time_t timeout_ms;
  SSL_CIPHER *c;
  char *pcVar11;
  timediff_t tVar12;
  uint *puVar13;
  SSL_METHOD *meth;
  SSL_CTX *pSVar14;
  ulong uVar15;
  SSL_SESSION *ses;
  BIO_METHOD *pBVar16;
  stack_st_X509 *psVar17;
  Curl_easy *pCVar18;
  X509_NAME *pXVar19;
  size_t sVar20;
  undefined8 uVar21;
  ASN1_INTEGER *pAVar22;
  ASN1_STRING *pAVar23;
  X509_EXTENSION *ex;
  BIO *pBVar24;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  ulong uVar25;
  ASN1_TIME *pAVar26;
  EVP_PKEY *pkey;
  X509 *pXVar27;
  char **ppcVar28;
  GENERAL_NAMES *a_00;
  int *piVar29;
  BIO *__s;
  Curl_easy *pCVar30;
  undefined8 extraout_RAX;
  X509_NAME_ENTRY *ne;
  void *__src;
  size_t uznum;
  OCSP_RESPONSE *resp;
  FILE *fp;
  X509 *pXVar31;
  X509_PUBKEY *pXVar32;
  uchar *pubkey;
  OCSP_BASICRESP *bs;
  X509_STORE *st;
  OCSP_SINGLERESP *single;
  long lVar33;
  undefined7 uVar34;
  curl_socket_t writefd;
  undefined7 in_register_00000011;
  long lVar35;
  size_t size;
  size_t size_00;
  long lVar36;
  char *pcVar37;
  long lVar38;
  long lVar39;
  curl_socket_t readfd0;
  long lVar40;
  long lVar41;
  X509_ALGOR *bn;
  long lVar42;
  int iVar43;
  ssl_connect_state sVar44;
  char cVar45;
  long lVar46;
  bool bVar47;
  CURLcode CStack_ba0;
  X509 *x509;
  Curl_easy *local_b70;
  BIO *local_b68;
  undefined8 local_b60;
  undefined8 local_b58;
  Curl_easy *local_b50;
  Curl_easy *local_b48;
  BIO *local_b40;
  ASN1_BIT_STRING *psig;
  Curl_easy *local_b30;
  EVP_PKEY *local_b20;
  long local_b18;
  X509 *local_b10;
  stack_st_X509 *local_b08;
  X509_ALGOR *palg;
  uint local_af4;
  _Bool *local_af0;
  in6_addr addr;
  char *local_ac0;
  anon_struct_16_2_531ec2c5 params;
  char error_buffer [256];
  char error_buffer_1 [256];
  
  local_b68 = (BIO *)CONCAT44(local_b68._4_4_,(int)CONCAT71(in_register_00000011,nonblocking));
  lVar46 = (long)sockindex;
  if (conn->ssl[lVar46].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  pCVar30 = conn->data;
  local_b40 = (BIO *)CONCAT44(local_b40._4_4_,conn->sock[lVar46]);
  sVar44 = conn->ssl[lVar46].connecting_state;
  if (sVar44 == ssl_connect_1) {
    tVar12 = Curl_timeleft(pCVar30,(curltime *)0x0,true);
    if (-1 < tVar12) {
      pCVar18 = conn->data;
      local_b48 = (Curl_easy *)CONCAT44(local_b48._4_4_,sockindex);
      if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        local_b10 = (X509 *)(conn->http_proxy).host.name;
        lVar36 = 0x6e8;
        lVar33 = 0x350;
        lVar39 = 0x358;
        lVar35 = 0x360;
        lVar42 = 0x718;
        lVar40 = 0x710;
        lVar41 = 0x340;
        lVar38 = 0x6e0;
      }
      else {
        local_b10 = (X509 *)(conn->host).name;
        lVar36 = 0x640;
        lVar33 = 0x308;
        lVar39 = 0x310;
        lVar35 = 0x318;
        lVar42 = 0x670;
        lVar40 = 0x668;
        lVar41 = 0x2f8;
        lVar38 = 0x638;
      }
      local_b70 = (Curl_easy *)CONCAT44(local_b70._4_4_,conn->sock[lVar46]);
      local_b20 = *(EVP_PKEY **)((conn->chunk).hexbuffer + lVar39 + -0x20);
      local_b60 = *(undefined8 *)((long)pCVar18->sockets + lVar42 + -0x80);
      uVar15 = *(ulong *)((conn->chunk).hexbuffer + lVar41 + -0x20);
      local_b58 = *(undefined8 *)((long)pCVar18->sockets + lVar40 + -0x80);
      local_b08 = *(stack_st_X509 **)((conn->chunk).hexbuffer + lVar35 + -0x20);
      bVar1 = (conn->chunk).hexbuffer[lVar33 + -0x20];
      uVar21 = *(undefined8 *)((long)pCVar18->sockets + lVar36 + -0x80);
      local_b50 = (Curl_easy *)(lVar46 * 0x18);
      local_b30 = pCVar30;
      local_af0 = done;
      CVar6 = Curl_ossl_seed(pCVar18);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      local_af4 = (uint)bVar1;
      *(undefined8 *)((long)pCVar18->sockets + lVar38 + -0x80) = 1;
      local_b18 = uVar21;
      if (7 < uVar15) {
        Curl_failf(pCVar18,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
        return CURLE_SSL_CONNECT_ERROR;
      }
      if ((0xf3UL >> (uVar15 & 0x3f) & 1) != 0) {
        meth = (SSL_METHOD *)TLS_client_method();
        pSVar14 = (SSL_CTX *)(conn->ssl[lVar46].backend)->ctx;
        if (pSVar14 != (SSL_CTX *)0x0) {
          SSL_CTX_free(pSVar14);
        }
        pSVar14 = SSL_CTX_new(meth);
        (conn->ssl[lVar46].backend)->ctx = (SSL_CTX *)pSVar14;
        if (pSVar14 != (SSL_CTX *)0x0) {
          SSL_CTX_ctrl(pSVar14,0x21,0x10,(void *)0x0);
          if (((pCVar18->set).fdebug != (curl_debug_callback)0x0) &&
             ((pCVar18->set).verbose == true)) {
            SSL_CTX_set_msg_callback((SSL_CTX *)(conn->ssl[lVar46].backend)->ctx,ssl_tls_trace);
            SSL_CTX_ctrl((SSL_CTX *)(conn->ssl[lVar46].backend)->ctx,0x10,0,conn);
          }
          CVar6 = (*(code *)(&DAT_0014f64c + *(int *)(&DAT_0014f64c + uVar15 * 4)))();
          return CVar6;
        }
        uVar15 = ERR_peek_error();
        ERR_error_string_n(uVar15,error_buffer,0x100);
        Curl_failf(pCVar18,"SSL: couldn\'t create a context: %s",error_buffer);
        return CURLE_OUT_OF_MEMORY;
      }
      if (uVar15 == 2) {
        pcVar37 = "OpenSSL was built without SSLv2 support";
      }
      else {
        pcVar37 = "OpenSSL was built without SSLv3 support";
      }
      Curl_failf(pCVar18,pcVar37);
      return CURLE_NOT_BUILT_IN;
    }
LAB_001422de:
    Curl_failf(pCVar30,"SSL connection timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  local_b48 = (Curl_easy *)CONCAT44(local_b48._4_4_,sockindex);
  local_b58 = CONCAT44(local_b58._4_4_,0x23);
  local_af0 = done;
  while (sVar44 - ssl_connect_2 < 3) {
    timeout_ms = Curl_timeleft(pCVar30,(curltime *)0x0,true);
    if (timeout_ms < 0) goto LAB_001422de;
    sVar44 = conn->ssl[lVar46].connecting_state;
    if ((sVar44 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar44 == ssl_connect_2_writing) {
        writefd = (curl_socket_t)local_b40;
      }
      readfd0 = -1;
      if (sVar44 == ssl_connect_2_reading) {
        readfd0 = (curl_socket_t)local_b40;
      }
      if ((byte)local_b68 != '\0') {
        timeout_ms = 0;
      }
      iVar4 = Curl_socket_check(readfd0,-1,writefd,timeout_ms);
      if (iVar4 < 0) {
        puVar13 = (uint *)__errno_location();
        Curl_failf(pCVar30,"select/poll on SSL socket, errno: %d",(ulong)*puVar13);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if (iVar4 == 0) {
        if ((byte)local_b68 != '\0') {
          *local_af0 = false;
          return CURLE_OK;
        }
        goto LAB_001422de;
      }
    }
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (lVar36 = 0x6e0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar36 = 0x638;
    }
    pCVar18 = conn->data;
    ERR_clear_error();
    iVar4 = SSL_connect((SSL *)(conn->ssl[lVar46].backend)->handle);
    if (iVar4 == 1) {
      conn->ssl[lVar46].connecting_state = ssl_connect_3;
      ssl = (SSL *)(conn->ssl[lVar46].backend)->handle;
      pcVar37 = "";
      if (ssl != (SSL *)0x0) {
        iVar4 = SSL_version(ssl);
        pcVar37 = "TLSv1.3";
        switch(iVar4) {
        case 0x300:
          pcVar37 = "SSLv3";
          break;
        case 0x301:
          pcVar37 = "TLSv1.0";
          break;
        case 0x302:
          pcVar37 = "TLSv1.1";
          break;
        case 0x303:
          pcVar37 = "TLSv1.2";
          break;
        case 0x304:
          break;
        default:
          if (iVar4 == 2) {
            pcVar37 = "SSLv2";
          }
          else {
            pcVar37 = "unknown";
          }
        }
      }
      c = SSL_get_current_cipher((SSL *)(conn->ssl[lVar46].backend)->handle);
      pcVar11 = SSL_CIPHER_get_name(c);
      Curl_infof(pCVar18,"SSL connection using %s / %s\n",pcVar37,pcVar11);
      if ((conn->bits).tls_enable_alpn == true) {
        SSL_get0_alpn_selected((conn->ssl[lVar46].backend)->handle,error_buffer_1,error_buffer);
        if (error_buffer._0_4_ == 0) {
          Curl_infof(pCVar18,"ALPN, server did not agree to a protocol\n");
        }
        else {
          Curl_infof(pCVar18,"ALPN, server accepted to use %.*s\n",error_buffer._0_8_ & 0xffffffff,
                     error_buffer_1._0_8_);
          if ((error_buffer._0_4_ == 8) && (*(long *)error_buffer_1._0_8_ == 0x312e312f70747468)) {
            conn->negnpn = 2;
          }
        }
      }
    }
    else {
      iVar4 = SSL_get_error((SSL *)(conn->ssl[lVar46].backend)->handle,iVar4);
      if (iVar4 == 3) {
        conn->ssl[lVar46].connecting_state = ssl_connect_2_writing;
      }
      else {
        if (iVar4 != 2) {
          memset(error_buffer_1,0,0x100);
          conn->ssl[lVar46].connecting_state = ssl_connect_2;
          uVar15 = ERR_get_error();
          uVar9 = (uint)uVar15;
          if (((-1 < (int)uVar9) && ((uVar9 & 0xff800000) == 0xa000000)) &&
             ((uVar9 & 0x7fffff) == 0x86)) {
            lVar46 = SSL_get_verify_result((SSL *)(conn->ssl[lVar46].backend)->handle);
            if (lVar46 == 0) {
              builtin_strncpy(error_buffer_1,"SSL certificate verification failed",0x24);
            }
            else {
              *(long *)((long)pCVar18->sockets + lVar36 + -0x80) = lVar46;
              pcVar37 = X509_verify_cert_error_string(lVar46);
              curl_msnprintf(error_buffer_1,0x100,"SSL certificate problem: %s",pcVar37);
            }
            CVar6 = CURLE_SSL_CACERT;
LAB_00142891:
            Curl_failf(pCVar18,"%s",error_buffer_1);
            return CVar6;
          }
          ERR_error_string_n(uVar15,error_buffer_1,0x100);
          if (uVar15 != 0) {
            CVar6 = CURLE_SSL_CONNECT_ERROR;
            goto LAB_00142891;
          }
          if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
            bVar47 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
            ppVar2 = &conn->http_proxy;
            if (bVar47) {
              ppVar2 = (proxy_info *)&conn->host;
            }
            pcVar37 = (ppVar2->host).name;
            if (!bVar47) {
              lVar46 = conn->port;
              goto LAB_00143a5f;
            }
          }
          else {
            pcVar37 = (conn->host).name;
          }
          lVar46 = (long)conn->remote_port;
LAB_00143a5f:
          pcVar11 = SSL_ERROR_to_str(iVar4);
          Curl_failf(pCVar18,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar11,pcVar37,
                     lVar46);
          return CURLE_SSL_CONNECT_ERROR;
        }
        conn->ssl[lVar46].connecting_state = ssl_connect_2_reading;
      }
    }
    sVar44 = conn->ssl[lVar46].connecting_state;
    if (((byte)local_b68 != '\0') && (sVar44 - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  if (sVar44 == ssl_connect_3) {
    pCVar30 = conn->data;
    cVar5 = (conn->http_proxy).proxytype;
    iVar4 = (int)local_b48;
    if ((cVar5 == CURLPROXY_HTTPS) &&
       (iVar7 = conn->sock[1], conn->proxy_ssl[iVar7 != -1].state != ssl_connection_complete)) {
      if ((pCVar30->set).proxy_ssl.primary.sessionid != false) {
LAB_001426af:
        error_buffer_1[0] = '\0';
        error_buffer_1[1] = '\0';
        error_buffer_1[2] = '\0';
        error_buffer_1[3] = '\0';
        error_buffer_1[4] = '\0';
        error_buffer_1[5] = '\0';
        error_buffer_1[6] = '\0';
        error_buffer_1[7] = '\0';
        ses = SSL_get1_session((SSL *)(conn->ssl[lVar46].backend)->handle);
        Curl_ssl_sessionid_lock(conn);
        _Var3 = Curl_ssl_getsessionid(conn,(void **)error_buffer_1,(size_t *)0x0,iVar4);
        if ((_Var3) || ((SSL_SESSION *)error_buffer_1._0_8_ == ses)) {
          if (_Var3) goto LAB_00142723;
          SSL_SESSION_free(ses);
        }
        else {
          Curl_infof(pCVar30,"old SSL session ID is stale, removing\n");
          Curl_ssl_delsessionid(conn,(void *)error_buffer_1._0_8_);
LAB_00142723:
          CVar6 = Curl_ssl_addsessionid(conn,ses,0,iVar4);
          if (CVar6 != CURLE_OK) {
            Curl_ssl_sessionid_unlock(conn);
            Curl_failf(pCVar30,"failed to store ssl session");
            return CVar6;
          }
        }
        Curl_ssl_sessionid_unlock(conn);
        cVar5 = (conn->http_proxy).proxytype;
        goto LAB_00142921;
      }
LAB_00142931:
      if (conn->proxy_ssl[iVar7 != -1].state == ssl_connection_complete) goto LAB_00142949;
      if ((conn->proxy_ssl_config).verifypeer == true) {
        pCVar30 = conn->data;
        local_b18 = 0x6e0;
        goto LAB_00142988;
      }
      cVar45 = (conn->proxy_ssl_config).verifyhost;
      pCVar30 = conn->data;
      local_b18 = 0x6e0;
    }
    else {
      if ((pCVar30->set).ssl.primary.sessionid == true) goto LAB_001426af;
LAB_00142921:
      if (cVar5 == CURLPROXY_HTTPS) {
        iVar7 = conn->sock[1];
        goto LAB_00142931;
      }
LAB_00142949:
      if ((conn->ssl_config).verifypeer == true) {
        pCVar30 = conn->data;
        local_b18 = 0x638;
LAB_00142988:
        cVar45 = '\x01';
      }
      else {
        cVar45 = (conn->ssl_config).verifyhost;
        pCVar30 = conn->data;
        local_b18 = 0x638;
      }
    }
    pBVar16 = BIO_s_mem();
    local_b10 = (X509 *)BIO_new(pBVar16);
    if ((pCVar30->set).ssl.certinfo == true) {
      pCVar18 = conn->data;
      psVar17 = SSL_get_peer_cert_chain((SSL *)(conn->ssl[lVar46].backend)->handle);
      if (psVar17 != (stack_st_X509 *)0x0) {
        iVar4 = OPENSSL_sk_num(psVar17);
        local_b60 = CONCAT44(local_b60._4_4_,iVar4);
        CVar6 = Curl_ssl_init_certinfo(pCVar18,iVar4);
        if (CVar6 == CURLE_OK) {
          local_b30 = (Curl_easy *)CONCAT71(local_b30._1_7_,cVar45);
          local_b70 = pCVar30;
          local_b48 = pCVar18;
          pBVar16 = BIO_s_mem();
          local_b68 = BIO_new(pBVar16);
          iVar4 = (int)local_b60;
          if ((int)local_b60 < 1) {
            iVar4 = 0;
          }
          local_b60 = CONCAT44(local_b60._4_4_,iVar4);
          local_b08 = psVar17;
          for (iVar7 = 0; iVar7 != iVar4; iVar7 = iVar7 + 1) {
            pCVar18 = (Curl_easy *)OPENSSL_sk_value(local_b08,iVar7);
            psig = (ASN1_BIT_STRING *)0x0;
            pXVar19 = X509_get_subject_name((X509 *)pCVar18);
            pBVar24 = local_b68;
            X509_NAME_print_ex(local_b68,pXVar19,0,0x82031f);
            sVar20 = BIO_ctrl(pBVar24,3,0,&x509);
            pCVar30 = local_b48;
            Curl_ssl_push_certinfo_len(local_b48,iVar7,"Subject",(char *)x509,sVar20);
            BIO_ctrl(pBVar24,1,0,(void *)0x0);
            pXVar19 = X509_get_issuer_name((X509 *)pCVar18);
            X509_NAME_print_ex(pBVar24,pXVar19,0,0x82031f);
            sVar20 = BIO_ctrl(pBVar24,3,0,&x509);
            Curl_ssl_push_certinfo_len(pCVar30,iVar7,"Issuer",(char *)x509,sVar20);
            BIO_ctrl(pBVar24,1,0,(void *)0x0);
            uVar21 = X509_get_version(pCVar18);
            BIO_printf(pBVar24,"%lx",uVar21);
            sVar20 = BIO_ctrl(pBVar24,3,0,&x509);
            local_b40 = (BIO *)CONCAT44(local_b40._4_4_,iVar7);
            Curl_ssl_push_certinfo_len(pCVar30,iVar7,"Version",(char *)x509,sVar20);
            BIO_ctrl(pBVar24,1,0,(void *)0x0);
            local_b50 = pCVar18;
            pAVar22 = X509_get_serialNumber((X509 *)pCVar18);
            if (pAVar22->type == 0x102) {
              BIO_puts(local_b68,"-");
            }
            for (lVar36 = 0; pBVar24 = local_b68, lVar36 < pAVar22->length; lVar36 = lVar36 + 1) {
              BIO_printf(local_b68,"%02x",(ulong)pAVar22->data[lVar36]);
            }
            sVar20 = BIO_ctrl(local_b68,3,0,&x509);
            pCVar30 = local_b48;
            Curl_ssl_push_certinfo_len
                      (local_b48,(curl_socket_t)local_b40,"Serial Number",(char *)x509,sVar20);
            BIO_ctrl(pBVar24,1,0,(void *)0x0);
            palg = (X509_ALGOR *)0x0;
            pAVar23 = ASN1_STRING_new();
            if (pAVar23 != (ASN1_STRING *)0x0) {
              X509_get0_signature(&psig,&palg,local_b50);
              X509_signature_print(pBVar24,(X509_ALGOR *)palg,pAVar23);
              ASN1_STRING_free(pAVar23);
              if (palg != (X509_ALGOR *)0x0) {
                i2a_ASN1_OBJECT(pBVar24,(ASN1_OBJECT *)palg->algorithm);
                sVar20 = BIO_ctrl(pBVar24,3,0,&x509);
                Curl_ssl_push_certinfo_len
                          (pCVar30,(curl_socket_t)local_b40,"Public Key Algorithm",(char *)x509,
                           sVar20);
                BIO_ctrl(pBVar24,1,0,(void *)0x0);
              }
            }
            uVar21 = X509_get0_extensions(local_b50);
            iVar4 = OPENSSL_sk_num(uVar21);
            if (0 < iVar4) {
              for (iVar4 = 0; iVar7 = OPENSSL_sk_num(uVar21), iVar4 < iVar7; iVar4 = iVar4 + 1) {
                ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar21,iVar4);
                pBVar16 = BIO_s_mem();
                pBVar24 = BIO_new(pBVar16);
                if (pBVar24 == (BIO *)0x0) break;
                a = X509_EXTENSION_get_object(ex);
                i2t_ASN1_OBJECT((char *)&params,0x80,a);
                iVar7 = X509V3_EXT_print(pBVar24,ex,0,0);
                if (iVar7 == 0) {
                  v = X509_EXTENSION_get_data(ex);
                  ASN1_STRING_print(pBVar24,v);
                }
                BIO_ctrl(pBVar24,0x73,0,&addr);
                pcVar37 = error_buffer;
                uVar15 = 0;
                while (pCVar30 = local_b48, uVar25 = *(ulong *)addr.__in6_u._0_8_, uVar15 < uVar25)
                {
                  bVar47 = *(char *)(*(long *)(addr.__in6_u._0_8_ + 8) + uVar15) == '\n';
                  pcVar11 = "";
                  if (bVar47) {
                    pcVar11 = ", ";
                  }
                  uVar15 = uVar15 + bVar47;
                  if (uVar25 <= uVar15) {
                    uVar25 = uVar15;
                  }
                  for (; uVar25 != uVar15; uVar15 = uVar15 + 1) {
                    if (*(char *)(*(long *)(addr.__in6_u._0_8_ + 8) + uVar15) != ' ') {
                      iVar7 = curl_msnprintf(pcVar37,(size_t)(error_buffer_1 + -(long)pcVar37),
                                             "%s%c",pcVar11);
                      pcVar37 = pcVar37 + iVar7;
                      uVar25 = uVar15;
                      break;
                    }
                  }
                  uVar15 = uVar25 + 1;
                }
                Curl_ssl_push_certinfo
                          (local_b48,(curl_socket_t)local_b40,(char *)&params,error_buffer);
                BIO_free(pBVar24);
              }
            }
            pCVar18 = local_b50;
            pAVar26 = (ASN1_TIME *)X509_get0_notBefore(local_b50);
            pBVar24 = local_b68;
            ASN1_TIME_print(local_b68,pAVar26);
            sVar20 = BIO_ctrl(pBVar24,3,0,&x509);
            iVar4 = (curl_socket_t)local_b40;
            Curl_ssl_push_certinfo_len
                      (pCVar30,(curl_socket_t)local_b40,"Start date",(char *)x509,sVar20);
            BIO_ctrl(pBVar24,1,0,(void *)0x0);
            pAVar26 = (ASN1_TIME *)X509_get0_notAfter(pCVar18);
            ASN1_TIME_print(pBVar24,pAVar26);
            sVar20 = BIO_ctrl(pBVar24,3,0,&x509);
            Curl_ssl_push_certinfo_len(pCVar30,iVar4,"Expire date",(char *)x509,sVar20);
            BIO_ctrl(pBVar24,1,0,(void *)0x0);
            pkey = X509_get_pubkey((X509 *)pCVar18);
            if (pkey == (EVP_PKEY *)0x0) {
              Curl_infof(pCVar30,"   Unable to load public key\n");
            }
            else {
              iVar4 = EVP_PKEY_get_id(pkey);
              if (iVar4 == 0x74) {
                uVar21 = EVP_PKEY_get0_DSA(pkey);
                local_b20 = pkey;
                DSA_get0_pqg(uVar21,error_buffer,&params,&addr);
                DSA_get0_key(uVar21,&palg,0);
                pBVar24 = local_b68;
                iVar4 = (curl_socket_t)local_b40;
                pubkey_show(pCVar30,(BIO *)local_b68,(curl_socket_t)local_b40,"dsa","p",
                            (BIGNUM *)error_buffer._0_8_);
                pubkey_show(pCVar30,(BIO *)pBVar24,iVar4,"dsa","q",(BIGNUM *)params.cert_id);
                pubkey_show(pCVar30,(BIO *)pBVar24,iVar4,"dsa","g",(BIGNUM *)addr.__in6_u._0_8_);
                pcVar37 = "dsa";
LAB_001431b6:
                pcVar11 = "pub_key";
                bn = palg;
LAB_001431bd:
                pkey = local_b20;
                pubkey_show(pCVar30,(BIO *)pBVar24,iVar4,pcVar37,pcVar11,(BIGNUM *)bn);
              }
              else {
                if (iVar4 == 0x1c) {
                  uVar21 = EVP_PKEY_get0_DH(pkey);
                  local_b20 = pkey;
                  DH_get0_pqg(uVar21,error_buffer,&params,&addr);
                  DH_get0_key(uVar21,&palg,0);
                  pBVar24 = local_b68;
                  iVar4 = (curl_socket_t)local_b40;
                  pubkey_show(pCVar30,(BIO *)local_b68,(curl_socket_t)local_b40,"dh","p",
                              (BIGNUM *)error_buffer._0_8_);
                  pubkey_show(pCVar30,(BIO *)pBVar24,iVar4,"dh","q",(BIGNUM *)params.cert_id);
                  pubkey_show(pCVar30,(BIO *)pBVar24,iVar4,"dh","g",(BIGNUM *)addr.__in6_u._0_8_);
                  pcVar37 = "dh";
                  goto LAB_001431b6;
                }
                if (iVar4 == 6) {
                  uVar21 = EVP_PKEY_get0_RSA(pkey);
                  RSA_get0_key(uVar21,error_buffer,&params,0);
                  pBVar24 = local_b68;
                  local_b20 = pkey;
                  BN_print(local_b68,(BIGNUM *)error_buffer._0_8_);
                  sVar20 = BIO_ctrl(pBVar24,3,0,&x509);
                  iVar4 = (curl_socket_t)local_b40;
                  Curl_ssl_push_certinfo_len
                            (pCVar30,(curl_socket_t)local_b40,"RSA Public Key",(char *)x509,sVar20);
                  BIO_ctrl(pBVar24,1,0,(void *)0x0);
                  pubkey_show(pCVar30,(BIO *)pBVar24,iVar4,"rsa","n",(BIGNUM *)error_buffer._0_8_);
                  pcVar37 = "rsa";
                  pcVar11 = "e";
                  bn = (X509_ALGOR *)params.cert_id;
                  goto LAB_001431bd;
                }
              }
              EVP_PKEY_free(pkey);
            }
            if (psig != (ASN1_BIT_STRING *)0x0) {
              for (lVar36 = 0; pBVar24 = local_b68, lVar36 < psig->length; lVar36 = lVar36 + 1) {
                BIO_printf(local_b68,"%02x:",(ulong)psig->data[lVar36]);
              }
              sVar20 = BIO_ctrl(local_b68,3,0,&x509);
              Curl_ssl_push_certinfo_len
                        (pCVar30,(curl_socket_t)local_b40,"Signature",(char *)x509,sVar20);
              BIO_ctrl(pBVar24,1,0,(void *)0x0);
            }
            pBVar24 = local_b68;
            PEM_write_bio_X509(local_b68,(X509 *)local_b50);
            sVar20 = BIO_ctrl(pBVar24,3,0,&x509);
            iVar7 = (curl_socket_t)local_b40;
            Curl_ssl_push_certinfo_len(pCVar30,(curl_socket_t)local_b40,"Cert",(char *)x509,sVar20);
            BIO_ctrl(pBVar24,1,0,(void *)0x0);
            iVar4 = (int)local_b60;
          }
          BIO_free(local_b68);
          pCVar30 = local_b70;
          cVar45 = (char)local_b30;
        }
      }
    }
    pXVar27 = (X509 *)SSL_get1_peer_certificate((conn->ssl[lVar46].backend)->handle);
    (conn->ssl[lVar46].backend)->server_cert = pXVar27;
    if (pXVar27 == (X509 *)0x0) {
      BIO_free((BIO *)local_b10);
      if (cVar45 != '\0') {
        Curl_failf(pCVar30,"SSL: couldn\'t get peer certificate!");
        return CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      local_b30 = (Curl_easy *)CONCAT71(local_b30._1_7_,cVar45);
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
        pcVar37 = "Proxy";
        if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
          pcVar37 = "Server";
        }
      }
      else {
        pcVar37 = "Server";
      }
      Curl_infof(pCVar30,"%s certificate:\n",pcVar37);
      pXVar19 = X509_get_subject_name((X509 *)(conn->ssl[lVar46].backend)->server_cert);
      iVar4 = x509_name_oneline((X509_NAME *)pXVar19,error_buffer_1,size);
      pcVar37 = "[NONE]";
      if (iVar4 == 0) {
        pcVar37 = error_buffer_1;
      }
      Curl_infof(pCVar30," subject: %s\n",pcVar37);
      pAVar26 = (ASN1_TIME *)X509_get0_notBefore((conn->ssl[lVar46].backend)->server_cert);
      pXVar31 = local_b10;
      ASN1_TIME_print((BIO *)local_b10,pAVar26);
      lVar36 = BIO_ctrl((BIO *)pXVar31,3,0,&local_ac0);
      Curl_infof(pCVar30," start date: %.*s\n",lVar36);
      BIO_ctrl((BIO *)pXVar31,1,0,(void *)0x0);
      pAVar26 = (ASN1_TIME *)X509_get0_notAfter((conn->ssl[lVar46].backend)->server_cert);
      ASN1_TIME_print((BIO *)pXVar31,pAVar26);
      lVar36 = BIO_ctrl((BIO *)pXVar31,3,0,&local_ac0);
      local_b70 = pCVar30;
      Curl_infof(pCVar30," expire date: %.*s\n",lVar36);
      BIO_ctrl((BIO *)pXVar31,1,0,(void *)0x0);
      BIO_free((BIO *)pXVar31);
      cVar5 = (conn->http_proxy).proxytype;
      if ((cVar5 == CURLPROXY_HTTPS) &&
         (iVar4 = conn->sock[1], conn->proxy_ssl[iVar4 != -1].state != ssl_connection_complete)) {
        if ((conn->proxy_ssl_config).verifyhost == true) {
          pXVar31 = (X509 *)(conn->ssl[lVar46].backend)->server_cert;
          local_b50 = conn->data;
LAB_001434e1:
          bVar47 = conn->proxy_ssl[iVar4 != -1].state == ssl_connection_complete;
          ppVar2 = &conn->http_proxy;
          if (bVar47) {
            ppVar2 = (proxy_info *)&conn->host;
          }
          ppcVar28 = &(ppVar2->host).name;
          lVar36 = 0x168;
          if (bVar47) {
            lVar36 = 0xe0;
          }
LAB_00143525:
          psVar17 = (stack_st_X509 *)*ppcVar28;
          local_b60 = *(undefined8 *)((conn->chunk).hexbuffer + lVar36 + -0x20);
          if (((conn->bits).ipv6_ip == true) &&
             (iVar4 = inet_pton(10,(char *)psVar17,error_buffer), iVar4 != 0)) {
            iVar4 = 7;
            local_b48 = (Curl_easy *)0x10;
          }
          else {
            iVar4 = inet_pton(2,(char *)psVar17,error_buffer);
            local_b48 = (Curl_easy *)(ulong)((uint)(iVar4 != 0) * 4);
            iVar4 = (uint)(iVar4 != 0) * 5 + 2;
          }
          pBVar24 = (BIO *)0x0;
          a_00 = (GENERAL_NAMES *)X509_get_ext_d2i(pXVar31,0x55,(int *)0x0,(int *)0x0);
          if (a_00 != (GENERAL_NAMES *)0x0) {
            local_b10 = pXVar31;
            local_b08 = psVar17;
            iVar7 = OPENSSL_sk_num(a_00);
            iVar43 = 0;
            bVar47 = false;
            local_b20 = (EVP_PKEY *)0x0;
            local_b68 = (BIO *)0x0;
            local_b40 = (BIO *)0x0;
            while ((iVar43 < iVar7 && (!bVar47))) {
              piVar29 = (int *)OPENSSL_sk_value(a_00,iVar43);
              iVar8 = *piVar29;
              uVar34 = (undefined7)((ulong)pBVar24 >> 8);
              if (iVar8 == 2) {
                pBVar24 = (BIO *)CONCAT71(uVar34,1);
                local_b40 = pBVar24;
              }
              else if (iVar8 == 7) {
                pBVar24 = (BIO *)CONCAT71(uVar34,1);
                local_b68 = pBVar24;
              }
              if (iVar8 == iVar4) {
                __s = (BIO *)ASN1_STRING_get0_data(*(undefined8 *)(piVar29 + 2));
                iVar8 = ASN1_STRING_length(*(ASN1_STRING **)(piVar29 + 2));
                if (iVar4 == 7) {
                  if (local_b48 != (Curl_easy *)(long)iVar8) goto LAB_001436b9;
                  iVar8 = bcmp(__s,error_buffer,(size_t)local_b48);
                  if (iVar8 == 0) {
                    bVar47 = false;
                    Curl_infof(local_b50,
                               " subjectAltName: host \"%s\" matched cert\'s IP address!\n",
                               local_b60);
                    local_b20 = (EVP_PKEY *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                  }
                  else {
LAB_001436b5:
                    bVar47 = false;
                  }
                }
                else {
                  if ((iVar4 != 2) ||
                     (pCVar30 = (Curl_easy *)strlen((char *)__s),
                     pCVar30 != (Curl_easy *)(long)iVar8)) goto LAB_001436b9;
                  iVar8 = Curl_cert_hostcheck((char *)__s,(char *)local_b08);
                  if (iVar8 == 0) goto LAB_001436b5;
                  Curl_infof(local_b50," subjectAltName: host \"%s\" matched cert\'s \"%s\"\n",
                             local_b60);
                  bVar47 = true;
                  pBVar24 = __s;
                }
              }
              else {
LAB_001436b9:
                bVar47 = false;
              }
              iVar43 = iVar43 + 1;
            }
            GENERAL_NAMES_free(a_00);
            pCVar30 = local_b50;
            uVar21 = local_b60;
            if (bVar47 || ((ulong)local_b20 & 1) != 0) goto LAB_00143ffa;
            pXVar31 = local_b10;
            psVar17 = local_b08;
            if ((((byte)local_b40 | (byte)local_b68) & 1) != 0) {
              Curl_infof(local_b50," subjectAltName does not match %s\n",local_b60);
              Curl_failf(pCVar30,
                         "SSL: no alternative certificate subject name matches target host name \'%s\'"
                         ,uVar21);
              CVar6 = CURLE_PEER_FAILED_VERIFICATION;
              goto LAB_00144265;
            }
          }
          params.cert_id = "";
          pXVar19 = X509_get_subject_name(pXVar31);
          if (pXVar19 == (X509_NAME *)0x0) {
LAB_00143f60:
            if (params.cert_id == "") {
              params.cert_id = (char *)0x0;
              goto LAB_00143fb2;
            }
            if (params.cert_id == (char *)0x0) goto LAB_00143fb2;
            iVar4 = Curl_cert_hostcheck(params.cert_id,(char *)psVar17);
            if (iVar4 == 0) {
              Curl_failf(local_b50,
                         "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                         ,params.cert_id);
              goto LAB_00143fc5;
            }
            Curl_infof(local_b50," common name: %s (matched)\n");
            CStack_ba0 = CURLE_OK;
          }
          else {
            iVar4 = -1;
            do {
              iVar7 = iVar4;
              iVar4 = X509_NAME_get_index_by_NID(pXVar19,0xd,iVar7);
            } while (-1 < iVar4);
            if (iVar7 < 0) goto LAB_00143f60;
            ne = X509_NAME_get_entry(pXVar19,iVar7);
            pAVar23 = X509_NAME_ENTRY_get_data(ne);
            if (pAVar23 == (ASN1_STRING *)0x0) goto LAB_00143f60;
            iVar4 = ASN1_STRING_type(pAVar23);
            if (iVar4 == 0xc) {
              uVar9 = ASN1_STRING_length(pAVar23);
              if ((int)uVar9 < 0) {
                pcVar37 = "";
              }
              else {
                pcVar37 = (char *)CRYPTO_malloc(uVar9 + 1,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/lib/vtls/openssl.c"
                                                ,0x5c9);
                params.cert_id = pcVar37;
                if (pcVar37 == (char *)0x0) goto LAB_00143fb2;
                __src = (void *)ASN1_STRING_get0_data(pAVar23);
                memcpy(pcVar37,__src,(ulong)uVar9);
                pcVar37[uVar9] = '\0';
              }
LAB_00143f48:
              uznum = strlen(pcVar37);
              uVar10 = curlx_uztosi(uznum);
              if (uVar10 == uVar9) goto LAB_00143f60;
              Curl_failf(local_b50,"SSL: illegal cert name field");
              CStack_ba0 = CURLE_PEER_FAILED_VERIFICATION;
              CVar6 = CURLE_PEER_FAILED_VERIFICATION;
              if (params.cert_id == "") goto LAB_00144265;
              goto LAB_00143fdb;
            }
            uVar9 = ASN1_STRING_to_UTF8((uchar **)&params,pAVar23);
            pcVar37 = params.cert_id;
            if (params.cert_id != (char *)0x0) goto LAB_00143f48;
LAB_00143fb2:
            Curl_failf(local_b50,"SSL: unable to obtain common name from peer certificate");
LAB_00143fc5:
            CStack_ba0 = CURLE_PEER_FAILED_VERIFICATION;
          }
LAB_00143fdb:
          CVar6 = CStack_ba0;
          if (params.cert_id != (char *)0x0) {
            CRYPTO_free(params.cert_id);
          }
          if (CVar6 != CURLE_OK) goto LAB_00144265;
        }
      }
      else if ((conn->ssl_config).verifyhost == true) {
        pXVar31 = (X509 *)(conn->ssl[lVar46].backend)->server_cert;
        local_b50 = conn->data;
        if (cVar5 == CURLPROXY_HTTPS) {
          iVar4 = conn->sock[1];
          goto LAB_001434e1;
        }
        ppcVar28 = &(conn->host).name;
        lVar36 = 0xe0;
        goto LAB_00143525;
      }
LAB_00143ffa:
      pXVar19 = X509_get_issuer_name((X509 *)(conn->ssl[lVar46].backend)->server_cert);
      iVar4 = x509_name_oneline((X509_NAME *)pXVar19,error_buffer_1,size_00);
      pCVar30 = local_b70;
      if (iVar4 == 0) {
        Curl_infof(local_b70," issuer: %s\n",error_buffer_1);
        if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
           (pCVar30 = local_b70,
           conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          pcVar37 = (local_b70->set).proxy_ssl.issuercert;
        }
        else {
          pcVar37 = (pCVar30->set).ssl.issuercert;
        }
        if (pcVar37 != (char *)0x0) {
          fp = fopen64(pcVar37,"r");
          if (fp == (FILE *)0x0) {
            if ((char)local_b30 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar36 = 0x6f0,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar36 = 0x648;
              }
              Curl_failf(local_b70,"SSL: Unable to open issuer cert (%s)",
                         *(undefined8 *)((long)local_b70->sockets + lVar36 + -0x80));
            }
            pXVar31 = (X509 *)(conn->ssl[lVar46].backend)->server_cert;
LAB_00144441:
            X509_free(pXVar31);
            (conn->ssl[lVar46].backend)->server_cert = (X509 *)0x0;
            return CURLE_SSL_ISSUER_ERROR;
          }
          pXVar31 = PEM_read_X509(fp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
          if (pXVar31 == (X509 *)0x0) {
            if ((char)local_b30 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar36 = 0x6f0,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar36 = 0x648;
              }
              Curl_failf(local_b70,"SSL: Unable to read issuer cert (%s)",
                         *(undefined8 *)((long)local_b70->sockets + lVar36 + -0x80));
            }
            X509_free((X509 *)(conn->ssl[lVar46].backend)->server_cert);
            X509_free((X509 *)0x0);
            fclose(fp);
            return CURLE_SSL_ISSUER_ERROR;
          }
          fclose(fp);
          iVar4 = X509_check_issued(pXVar31,(X509 *)(conn->ssl[lVar46].backend)->server_cert);
          pCVar30 = local_b70;
          if (iVar4 != 0) {
            if ((char)local_b30 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar36 = 0x6f0,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar36 = 0x648;
              }
              Curl_failf(local_b70,"SSL: Certificate issuer check failed (%s)",
                         *(undefined8 *)((long)local_b70->sockets + lVar36 + -0x80));
            }
            X509_free((X509 *)(conn->ssl[lVar46].backend)->server_cert);
            goto LAB_00144441;
          }
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar36 = 0x6f0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar36 = 0x648;
          }
          Curl_infof(local_b70," SSL certificate issuer check ok (%s)\n",
                     *(undefined8 *)((long)local_b70->sockets + lVar36 + -0x80));
          X509_free(pXVar31);
        }
        lVar36 = SSL_get_verify_result((SSL *)(conn->ssl[lVar46].backend)->handle);
        *(long *)((long)pCVar30->sockets + local_b18 + -0x80) = lVar36;
        if (lVar36 == 0) {
          local_b58 = (ulong)local_b58._4_4_ << 0x20;
          Curl_infof(pCVar30," SSL certificate verify ok.\n");
        }
        else {
          if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
             (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
            if ((conn->proxy_ssl_config).verifypeer == false) {
LAB_0014475d:
              pcVar37 = X509_verify_cert_error_string(lVar36);
              local_b58 = local_b58 & 0xffffffff00000000;
              Curl_infof(local_b70," SSL certificate verify result: %s (%ld), continuing anyway.\n",
                         pcVar37,lVar36);
              goto LAB_00144038;
            }
          }
          else if ((conn->ssl_config).verifypeer != true) goto LAB_0014475d;
          local_b58 = CONCAT44(local_b58._4_4_,0x33);
          if ((char)local_b30 != '\0') {
            pcVar37 = X509_verify_cert_error_string(lVar36);
            Curl_failf(local_b70,"SSL certificate verify result: %s (%ld)",pcVar37,lVar36);
          }
        }
      }
      else if ((char)local_b30 != '\0') {
        Curl_failf(local_b70,"SSL: couldn\'t get X509-issuer name!");
      }
LAB_00144038:
      cVar5 = (conn->http_proxy).proxytype;
      if ((cVar5 == CURLPROXY_HTTPS) &&
         (iVar4 = conn->sock[1], conn->proxy_ssl[iVar4 != -1].state != ssl_connection_complete)) {
        if ((conn->proxy_ssl_config).verifystatus != false) {
LAB_001440da:
          pCVar30 = conn->data;
          lVar36 = SSL_ctrl((SSL *)(conn->ssl[lVar46].backend)->handle,0x46,0,error_buffer);
          if (error_buffer._0_8_ == 0) {
            pcVar37 = "No OCSP response received";
LAB_00144247:
            resp = (OCSP_RESPONSE *)0x0;
LAB_0014424a:
            Curl_failf(pCVar30,pcVar37);
LAB_00144254:
            CVar6 = CURLE_SSL_INVALIDCERTSTATUS;
          }
          else {
            resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)error_buffer,lVar36);
            if (resp == (OCSP_RESPONSE *)0x0) {
              pcVar37 = "Invalid OCSP response";
              goto LAB_00144247;
            }
            uVar9 = OCSP_response_status(resp);
            if (uVar9 != 0) {
              pcVar37 = OCSP_response_status_str((long)(int)uVar9);
              Curl_failf(pCVar30,"Invalid OCSP response status: %s (%d)",pcVar37,(ulong)uVar9);
              goto LAB_00144254;
            }
            bs = OCSP_response_get1_basic(resp);
            if (bs == (OCSP_BASICRESP *)0x0) {
              pcVar37 = "Invalid OCSP response";
              goto LAB_0014424a;
            }
            psVar17 = SSL_get_peer_cert_chain((SSL *)(conn->ssl[lVar46].backend)->handle);
            st = SSL_CTX_get_cert_store((SSL_CTX *)(conn->ssl[lVar46].backend)->ctx);
            iVar4 = OCSP_basic_verify(bs,psVar17,st,0);
            if (iVar4 < 1) {
              Curl_failf(pCVar30,"OCSP response verification failed");
              CVar6 = CURLE_SSL_INVALIDCERTSTATUS;
            }
            else {
              for (iVar4 = 0; iVar7 = OCSP_resp_count(bs), iVar4 < iVar7; iVar4 = iVar4 + 1) {
                single = OCSP_resp_get0(bs,iVar4);
                if (single != (OCSP_SINGLERESP *)0x0) {
                  uVar9 = OCSP_single_get0_status
                                    (single,(int *)&psig,(ASN1_GENERALIZEDTIME **)&params,
                                     (ASN1_GENERALIZEDTIME **)&addr,(ASN1_GENERALIZEDTIME **)&x509);
                  iVar7 = OCSP_check_validity((ASN1_GENERALIZEDTIME *)addr.__in6_u._0_8_,
                                              (ASN1_GENERALIZEDTIME *)x509,300,-1);
                  if (iVar7 == 0) {
                    Curl_failf(pCVar30,"OCSP response has expired");
                  }
                  else {
                    pcVar37 = OCSP_cert_status_str((long)(int)uVar9);
                    Curl_infof(pCVar30,"SSL certificate status: %s (%d)\n",pcVar37,(ulong)uVar9);
                    if (uVar9 != 2) {
                      if (uVar9 != 1) goto LAB_00144541;
                      pcVar37 = OCSP_crl_reason_str((long)(int)psig);
                      Curl_failf(pCVar30,"SSL certificate revocation reason: %s (%d)",pcVar37,
                                 (ulong)psig & 0xffffffff);
                    }
                  }
                  CVar6 = CURLE_SSL_INVALIDCERTSTATUS;
                  goto LAB_00144e4d;
                }
LAB_00144541:
              }
              CVar6 = CURLE_OK;
            }
LAB_00144e4d:
            OCSP_BASICRESP_free(bs);
          }
          OCSP_RESPONSE_free(resp);
          if (CVar6 != CURLE_OK) {
LAB_00144265:
            X509_free((X509 *)(conn->ssl[lVar46].backend)->server_cert);
            (conn->ssl[lVar46].backend)->server_cert = (X509 *)0x0;
            return CVar6;
          }
          cVar5 = (conn->http_proxy).proxytype;
          local_b58 = local_b58 & 0xffffffff00000000;
          goto LAB_00144294;
        }
        CVar6 = CURLE_OK;
        if ((char)local_b30 != '\0') {
          CVar6 = (CURLcode)local_b58;
        }
LAB_001442b3:
        lVar36 = (ulong)(conn->proxy_ssl[iVar4 != -1].state != ssl_connection_complete) * 8 + 0x8e0;
      }
      else {
        if ((conn->ssl_config).verifystatus == true) goto LAB_001440da;
LAB_00144294:
        CVar6 = CURLE_OK;
        if ((char)local_b30 != '\0') {
          CVar6 = (CURLcode)local_b58;
        }
        lVar36 = 0x8e0;
        if (cVar5 == CURLPROXY_HTTPS) {
          iVar4 = conn->sock[1];
          goto LAB_001442b3;
        }
      }
      pcVar37 = *(char **)((long)local_b70->sockets + lVar36 + -0x80);
      local_ac0 = pcVar37;
      if ((CVar6 == CURLE_OK) && (pcVar37 != (char *)0x0)) {
        pXVar27 = (conn->ssl[lVar46].backend)->server_cert;
        if (pXVar27 == (X509 *)0x0) {
LAB_001443a3:
          CVar6 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
        }
        else {
          pXVar32 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar27);
          uVar9 = i2d_X509_PUBKEY(pXVar32,(uchar **)0x0);
          if ((int)uVar9 < 1) goto LAB_001443a3;
          uVar15 = (ulong)uVar9;
          pubkey = (uchar *)(*Curl_cmalloc)(uVar15);
          error_buffer._0_8_ = pubkey;
          if (pubkey == (uchar *)0x0) goto LAB_001443a3;
          pXVar32 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar27);
          uVar10 = i2d_X509_PUBKEY(pXVar32,(uchar **)error_buffer);
          if ((error_buffer._0_8_ == 0 || uVar9 != uVar10) ||
              error_buffer._0_8_ - (long)pubkey != uVar15) {
            CVar6 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          }
          else {
            CVar6 = Curl_pin_peer_pubkey(local_b70,pcVar37,pubkey,uVar15);
          }
          (*Curl_cfree)(pubkey);
          if (CVar6 == CURLE_OK) {
            CVar6 = CURLE_OK;
            goto LAB_001443bf;
          }
        }
        Curl_failf(local_b70,"SSL: public key does not match pinned public key!");
      }
LAB_001443bf:
      X509_free((X509 *)(conn->ssl[lVar46].backend)->server_cert);
      (conn->ssl[lVar46].backend)->server_cert = (X509 *)0x0;
      conn->ssl[lVar46].connecting_state = ssl_connect_done;
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
    }
  }
  else if (sVar44 != ssl_connect_done) {
    _Var3 = false;
    goto LAB_0014256b;
  }
  conn->ssl[lVar46].state = ssl_connection_complete;
  conn->recv[lVar46] = ossl_recv;
  conn->send[lVar46] = ossl_send;
  _Var3 = true;
LAB_0014256b:
  *local_af0 = _Var3;
  conn->ssl[lVar46].connecting_state = ssl_connect_1;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  time_t timeout_ms;
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}